

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsMotorAngle.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsMotorAngle::ArchiveIN(ChShaftsMotorAngle *this,ChArchiveIn *marchive)

{
  ChNameValue<std::shared_ptr<chrono::ChFunction>_> local_38;
  
  ChArchiveIn::VersionRead<chrono::ChShaftsMotorAngle>(marchive);
  ChShaftsMotorBase::ArchiveIN(&this->super_ChShaftsMotorBase,marchive);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->motor_torque;
  local_38._name = "motor_torque";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = (shared_ptr<chrono::ChFunction> *)&this->rot_offset;
  local_38._name = "this->rot_offset";
  local_38._flags = '\0';
  (**(code **)(*(long *)marchive + 0x20))(marchive,&local_38);
  local_38._value = &this->f_rot;
  local_38._name = "this->f_rot";
  local_38._flags = '\0';
  ChArchiveIn::in<chrono::ChFunction>(marchive,&local_38);
  return;
}

Assistant:

void ChShaftsMotorAngle::ArchiveIN(ChArchiveIn& marchive) {
    // version number
    /*int version =*/ marchive.VersionRead<ChShaftsMotorAngle>();

    // deserialize parent class:
    ChShaftsMotorBase::ArchiveIN(marchive);

    // deserialize all member data:
    marchive >> CHNVP(motor_torque);
    marchive >> CHNVP(this->rot_offset);
    marchive >> CHNVP(this->f_rot);
}